

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

double * __thiscall data_structures::Matrix<double>::at(Matrix<double> *this,size_t row,size_t col)

{
  out_of_range *poVar1;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->columns_ <= col) {
    poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_60,col);
    std::operator+(&local_40,"Matrix<ElementType>::at() : col is out of range, col accessed = ",
                   &local_60);
    std::out_of_range::out_of_range(poVar1,(string *)&local_40);
    __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (row < this->rows_) {
    return (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + this->columns_ * row + col;
  }
  poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_60,row);
  std::operator+(&local_40,"Matrix<ElementType>::at() : row is out of range, row accessed = ",
                 &local_60);
  std::out_of_range::out_of_range(poVar1,(string *)&local_40);
  __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

ElementType& Matrix<ElementType>::at(size_t row, size_t col) {
  // NOTE: Using at() for checking bounds.
  // TODO: There is a max original x-coordinate that can be addressed - maybe
  //       should be verified here.
  if (col >= columns_ || col < 0) {
    throw std::out_of_range ("Matrix<ElementType>::at() : col is out of range, col accessed = " + std::to_string(col));
  }
  if (row >= rows_) {
    throw std::out_of_range ("Matrix<ElementType>::at() : row is out of range, row accessed = " + std::to_string(row));
  }
  return data_[row * columns_ + col];
}